

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_ratio(REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_120;
  double local_118;
  double local_110;
  REF_DBL local_108;
  double local_100;
  double local_f0;
  double local_e8;
  double local_d8;
  double local_d0;
  double local_c0;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL m [6];
  REF_DBL r_max;
  REF_DBL r_min;
  REF_DBL r;
  REF_DBL ratio1;
  REF_DBL ratio0;
  REF_DBL length;
  REF_DBL direction [3];
  REF_DBL *ratio_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_NODE ref_node_local;
  
  if (((((node0 < 0) || (ref_node->max <= node0)) || (ref_node->global[node0] < 0)) ||
      ((node1 < 0 || (ref_node->max <= node1)))) || (ref_node->global[node1] < 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x57b,
           "ref_node_ratio",3,"node invalid");
    ref_node_local._4_4_ = 3;
  }
  else {
    dVar2 = ref_node->real[node1 * 0xf] - ref_node->real[node0 * 0xf];
    dVar3 = ref_node->real[node1 * 0xf + 1] - ref_node->real[node0 * 0xf + 1];
    dVar4 = ref_node->real[node1 * 0xf + 2] - ref_node->real[node0 * 0xf + 2];
    local_f0 = sqrt(dVar4 * dVar4 + dVar2 * dVar2 + dVar3 * dVar3);
    if (local_f0 * 1e+20 <= 0.0) {
      local_c0 = -(local_f0 * 1e+20);
    }
    else {
      local_c0 = local_f0 * 1e+20;
    }
    local_d0 = dVar2;
    if (dVar2 <= 0.0) {
      local_d0 = -dVar2;
    }
    if (local_d0 < local_c0) {
      if (local_f0 * 1e+20 <= 0.0) {
        local_d8 = -(local_f0 * 1e+20);
      }
      else {
        local_d8 = local_f0 * 1e+20;
      }
      local_e8 = dVar3;
      if (dVar3 <= 0.0) {
        local_e8 = -dVar3;
      }
      if (local_e8 < local_d8) {
        if (local_f0 * 1e+20 <= 0.0) {
          local_f0 = -(local_f0 * 1e+20);
        }
        else {
          local_f0 = local_f0 * 1e+20;
        }
        local_100 = dVar4;
        if (dVar4 <= 0.0) {
          local_100 = -dVar4;
        }
        if (local_100 < local_f0) {
          if (ref_node->ratio_method == 2) {
            uVar1 = ref_node_ratio_log_quadrature(ref_node,node0,node1,ratio);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x58f,"ref_node_ratio",(ulong)uVar1,"ratio");
              return uVar1;
            }
            return 0;
          }
          uVar1 = ref_node_metric_get(ref_node,node0,(REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x593,"ref_node_ratio",(ulong)uVar1,"node0 m");
            return uVar1;
          }
          dVar5 = sqrt(dVar4 * (m[4] * dVar4 + m[1] * dVar2 + m[3] * dVar3) +
                       dVar2 * (m[1] * dVar4 + _ref_private_macro_code_rss_1 * dVar2 + m[0] * dVar3)
                       + dVar3 * (m[3] * dVar4 + m[0] * dVar2 + m[2] * dVar3));
          uVar1 = ref_node_metric_get(ref_node,node1,(REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x595,"ref_node_ratio",(ulong)uVar1,"node1 m");
            return uVar1;
          }
          local_108 = sqrt(dVar4 * (m[4] * dVar4 + m[1] * dVar2 + m[3] * dVar3) +
                           dVar2 * (m[1] * dVar4 +
                                   _ref_private_macro_code_rss_1 * dVar2 + m[0] * dVar3) +
                           dVar3 * (m[3] * dVar4 + m[0] * dVar2 + m[2] * dVar3));
          if ((dVar5 < 1e-12) || (local_108 < 1e-12)) {
            if (dVar5 < local_108) {
              local_108 = dVar5;
            }
            *ratio = local_108;
            return 0;
          }
          local_110 = local_108;
          if (dVar5 < local_108) {
            local_110 = dVar5;
          }
          local_118 = local_108;
          if (local_108 < dVar5) {
            local_118 = dVar5;
          }
          m[5] = local_118;
          local_118 = local_110 / local_118;
          if (local_118 - 1.0 <= 0.0) {
            local_120 = -(local_118 - 1.0);
          }
          else {
            local_120 = local_118 - 1.0;
          }
          if (local_120 < 1e-12) {
            *ratio = (dVar5 + local_108) * 0.5;
            return 0;
          }
          dVar2 = log(local_118);
          *ratio = (local_110 * (local_118 - 1.0)) / (local_118 * dVar2);
          return 0;
        }
      }
    }
    *ratio = 0.0;
    ref_node_local._4_4_ = 0;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_ratio(REF_NODE ref_node, REF_INT node0,
                                  REF_INT node1, REF_DBL *ratio) {
  REF_DBL direction[3], length;
  REF_DBL ratio0, ratio1;
  REF_DBL r, r_min, r_max;
  REF_DBL m[6];

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1))
    RSS(REF_INVALID, "node invalid");

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));

  length = ref_math_dot(direction, direction);
  length = sqrt(length);

  if (!ref_math_divisible(direction[0], length) ||
      !ref_math_divisible(direction[1], length) ||
      !ref_math_divisible(direction[2], length)) {
    *ratio = 0.0;
    return REF_SUCCESS;
  }

  if (REF_NODE_RATIO_QUADRATURE == ref_node->ratio_method) {
    RSS(ref_node_ratio_log_quadrature(ref_node, node0, node1, ratio), "ratio");
    return REF_SUCCESS;
  }

  RSS(ref_node_metric_get(ref_node, node0, m), "node0 m");
  ratio0 = ref_matrix_sqrt_vt_m_v(m, direction);
  RSS(ref_node_metric_get(ref_node, node1, m), "node1 m");
  ratio1 = ref_matrix_sqrt_vt_m_v(m, direction);

  /* Loseille Lohner IMR 18 (2009) pg 613 */
  /* Alauzet Finite Elements in Analysis and Design 46 (2010) pg 185 */

  if (ratio0 < 1.0e-12 || ratio1 < 1.0e-12) {
    *ratio = MIN(ratio0, ratio1);
    return REF_SUCCESS;
  }

  r_min = MIN(ratio0, ratio1);
  r_max = MAX(ratio0, ratio1);

  r = r_min / r_max;

  if (ABS(r - 1.0) < 1.0e-12) {
    *ratio = 0.5 * (ratio0 + ratio1);
    return REF_SUCCESS;
  }

  *ratio = r_min * (r - 1.0) / (r * log(r));

  return REF_SUCCESS;
}